

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockContextUpdateDocking(ImGuiContext *ctx)

{
  ImGuiDockContext *pIVar1;
  ImGuiDockRequest *pIVar2;
  ImGuiDockNode *node;
  int n_1;
  ImGuiContext *g;
  long lVar3;
  int n;
  long lVar4;
  
  if (((ctx->IO).ConfigFlags & 0x40) != 0) {
    pIVar1 = ctx->DockContext;
    lVar3 = 0;
    for (lVar4 = 0; lVar4 < (pIVar1->Requests).Size; lVar4 = lVar4 + 1) {
      pIVar2 = (pIVar1->Requests).Data;
      if (*(int *)((long)&pIVar2->Type + lVar3) == 1) {
        DockContextProcessDock(ctx,(ImGuiDockRequest *)((long)&pIVar2->Type + lVar3));
      }
      lVar3 = lVar3 + 0x40;
    }
    ImVector<ImGuiDockRequest>::resize(&pIVar1->Requests,0);
    lVar3 = 8;
    for (lVar4 = 0; lVar4 < (pIVar1->Nodes).Data.Size; lVar4 = lVar4 + 1) {
      node = *(ImGuiDockNode **)((long)&((pIVar1->Nodes).Data.Data)->key + lVar3);
      if (((node != (ImGuiDockNode *)0x0) && (node->ParentNode == (ImGuiDockNode *)0x0)) &&
         ((node->LocalFlags & 0x400U) == 0)) {
        DockNodeUpdate(node);
      }
      lVar3 = lVar3 + 0x10;
    }
  }
  return;
}

Assistant:

void ImGui::DockContextUpdateDocking(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc = ctx->DockContext;
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
        return;

    // Process Docking requests
    for (int n = 0; n < dc->Requests.Size; n++)
        if (dc->Requests[n].Type == ImGuiDockRequestType_Dock)
            DockContextProcessDock(ctx, &dc->Requests[n]);
    dc->Requests.resize(0);

    // Create windows for each automatic docking nodes
    // We can have NULL pointers when we delete nodes, but because ID are recycled this should amortize nicely (and our node count will never be very high)
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
            if (node->IsFloatingNode())
                DockNodeUpdate(node);
}